

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.cc
# Opt level: O0

bool __thiscall
sptk::ScalarOperation::AddMagicNumberReplacer(ScalarOperation *this,double replacement_number)

{
  value_type *__x;
  MagicNumberReplacer *this_00;
  long in_RDI;
  bool bVar1;
  
  bVar1 = (*(byte *)(in_RDI + 8) & 1) != 0;
  if (bVar1) {
    __x = (value_type *)(in_RDI + 0x10);
    this_00 = (MagicNumberReplacer *)operator_new(0x10);
    anon_unknown.dwarf_5ae6::MagicNumberReplacer::MagicNumberReplacer(this_00,(double)__x);
    std::
    vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
    ::push_back((vector<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
                 *)this_00,__x);
    *(undefined1 *)(in_RDI + 8) = 0;
  }
  return bVar1;
}

Assistant:

bool ScalarOperation::AddMagicNumberReplacer(double replacement_number) {
  if (!use_magic_number_) return false;
  modules_.push_back(new MagicNumberReplacer(replacement_number));
  use_magic_number_ = false;
  return true;
}